

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB555,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  EBlend EVar5;
  long lVar6;
  long lVar7;
  FSpecialColormap *pFVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  pFVar8 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0064d5f3_caseD_0:
    if (0 < count) {
      lVar9 = 0;
      do {
        pout[lVar9 * 4 + 2] = (char)*(ushort *)pin << 3;
        pout[lVar9 * 4 + 1] = (byte)(*(ushort *)pin >> 2) & 0xf8;
        pout[lVar9 * 4] = (byte)(*(ushort *)pin >> 7) & 0xf8;
        pout[lVar9 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar9 = lVar9 + 1;
      } while (count != (int)lVar9);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0064d5f3_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)pin;
          uVar10 = (uVar2 >> 2 & 0xf8) * 0x8f + ((uint)uVar2 * 8 & 0xff) * 0x4d +
                   (uVar2 >> 7 & 0xf8) * 0x24 >> 0xc;
          BVar1 = IcePalette[uVar10][1];
          pout[lVar9 * 4 + 2] = IcePalette[uVar10][0];
          pout[lVar9 * 4 + 1] = BVar1;
          pout[lVar9 * 4] = IcePalette[uVar10][2];
          pout[lVar9 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar9 = lVar9 + 1;
        } while (count != (int)lVar9);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)pin;
          iVar12 = inf->blendcolor[3];
          iVar11 = inf->blendcolor[1];
          iVar4 = inf->blendcolor[2];
          pout[lVar9 * 4 + 2] =
               (BYTE)(((uint)uVar2 * 8 & 0xff) * iVar12 + inf->blendcolor[0] >> 0x10);
          pout[lVar9 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 + iVar11 >> 0x10);
          pout[lVar9 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar12 + iVar4 >> 0x10);
          pout[lVar9 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar9 = lVar9 + 1;
        } while (count != (int)lVar9);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)pin;
          iVar12 = inf->blendcolor[1];
          iVar11 = inf->blendcolor[2];
          pout[lVar9 * 4 + 2] = (BYTE)(((uint)uVar2 * 8 & 0xff) * inf->blendcolor[0] >> 0x10);
          pout[lVar9 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 >> 0x10);
          pout[lVar9 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar11 >> 0x10);
          pout[lVar9 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar9 = lVar9 + 1;
        } while (count != (int)lVar9);
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar9 = (long)EVar5;
      if (lVar9 < 0x21) {
        if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
          iVar12 = 0x20 - EVar5;
          lVar9 = 0;
          do {
            uVar2 = *(ushort *)pin;
            uVar10 = (uint)uVar2 * 8 & 0xff;
            uVar16 = uVar2 >> 2 & 0xf8;
            uVar15 = uVar2 >> 7 & 0xf8;
            iVar11 = (uVar16 * 0x8f + uVar10 * 0x4d + uVar15 * 0x24 >> 8) * (EVar5 + BLEND_MODULATE)
            ;
            lVar13 = (long)(int)(uVar10 * iVar12 + iVar11) * 0x84210843;
            lVar6 = (long)(int)(uVar16 * iVar12 + iVar11) * 0x84210843;
            lVar7 = (long)(int)(uVar15 * iVar12 + iVar11) * 0x84210843;
            pout[lVar9 * 4 + 2] = (char)(uint)((ulong)lVar13 >> 0x24) - (char)(lVar13 >> 0x3f);
            pout[lVar9 * 4 + 1] = (char)(uint)((ulong)lVar6 >> 0x24) - (char)(lVar6 >> 0x3f);
            pout[lVar9 * 4] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
            pout[lVar9 * 4 + 3] = 0xff;
            pin = (BYTE *)((long)pin + (long)step);
            lVar9 = lVar9 + 1;
          } while (count != (int)lVar9);
        }
      }
      else if (0 < count) {
        lVar13 = 0;
        do {
          uVar2 = *(ushort *)pin;
          uVar14 = (ulong)((uVar2 >> 2 & 0xf8) * 0x8f + ((uint)uVar2 * 8 & 0xff) * 0x4d +
                           (uVar2 >> 7 & 0xf8) * 0x24 >> 8);
          uVar3 = *(undefined2 *)((long)pFVar8 + uVar14 * 4 + lVar9 * 0x518 + -0xa700);
          pout[lVar13 * 4 + 2] = *(BYTE *)((long)pFVar8 + uVar14 * 4 + lVar9 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar13 * 4) = uVar3;
          pout[lVar13 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar13 = lVar13 + 1;
        } while (count != (int)lVar13);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}